

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.h
# Opt level: O0

bool SL::Screen_Capture::
     TryCaptureMouse<SL::Screen_Capture::X11MouseProcessor,std::shared_ptr<SL::Screen_Capture::Thread_Data>>
               (shared_ptr<SL::Screen_Capture::Thread_Data> *data)

{
  bool bVar1;
  DUPL_RETURN DVar2;
  element_type *peVar3;
  element_type *this;
  shared_ptr<SL::Screen_Capture::Timer> *__stat_loc;
  X11MouseProcessor *in_RDI;
  shared_ptr<SL::Screen_Capture::Timer> timer;
  DUPL_RETURN ret;
  X11MouseProcessor frameprocessor;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  milliseconds in_stack_ffffffffffffff20;
  X11MouseProcessor *in_stack_ffffffffffffff28;
  Timer *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  duration<long,_std::ratio<1L,_1000L>_> local_80 [2];
  DUPL_RETURN local_70;
  undefined4 local_40;
  byte local_1;
  
  X11MouseProcessor::X11MouseProcessor((X11MouseProcessor *)in_stack_ffffffffffffff20.__r);
  local_40 = 0x1000;
  std::make_unique<unsigned_char[]>(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffff20.__r,
             (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffff20.__r);
  __rtime = local_80;
  std::shared_ptr<SL::Screen_Capture::Thread_Data>::shared_ptr
            ((shared_ptr<SL::Screen_Capture::Thread_Data> *)in_stack_ffffffffffffff20.__r,
             (shared_ptr<SL::Screen_Capture::Thread_Data> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  DVar2 = X11MouseProcessor::Init
                    (in_stack_ffffffffffffff28,
                     (shared_ptr<SL::Screen_Capture::Thread_Data> *)in_stack_ffffffffffffff20.__r);
  std::shared_ptr<SL::Screen_Capture::Thread_Data>::~shared_ptr
            ((shared_ptr<SL::Screen_Capture::Thread_Data> *)0x14e70b);
  local_70 = DVar2;
  if (DVar2 == DUPL_RETURN_SUCCESS) {
    do {
      std::
      __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x14e774);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff28);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_1 = 1;
        break;
      }
      std::shared_ptr<SL::Screen_Capture::Timer>::shared_ptr
                ((shared_ptr<SL::Screen_Capture::Timer> *)0x14e7a1);
      peVar3 = std::
               __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14e7ae);
      __stat_loc = &(peVar3->ScreenCaptureData).MouseTimer;
      std::shared_ptr<SL::Screen_Capture::Timer>::operator=
                ((shared_ptr<SL::Screen_Capture::Timer> *)in_stack_ffffffffffffff20.__r,
                 (shared_ptr<SL::Screen_Capture::Timer> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      std::__shared_ptr_access<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x14e7c9);
      Timer::start(in_stack_ffffffffffffff30);
      local_70 = X11MouseProcessor::ProcessFrame(in_RDI);
      if (local_70 == DUPL_RETURN_SUCCESS) {
        this = std::
               __shared_ptr_access<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14e8dc);
        Timer::wait(this,__stat_loc);
        while( true ) {
          std::
          __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x14e8f5);
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff28);
          if (!bVar1) break;
          in_stack_ffffffffffffff20 = ms<(char)53,(char)48>();
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
        }
        bVar1 = false;
      }
      else {
        if (local_70 == DUPL_RETURN_ERROR_EXPECTED) {
          std::
          __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x14e80d);
          std::atomic<bool>::operator=
                    ((atomic<bool> *)in_stack_ffffffffffffff20.__r,(bool)in_stack_ffffffffffffff1f);
          in_stack_ffffffffffffff30 =
               (Timer *)std::operator<<((ostream *)&std::cout,
                                        "Exiting Thread due to expected error ");
          std::ostream::operator<<
                    ((ostream *)in_stack_ffffffffffffff30,std::endl<char,std::char_traits<char>>);
        }
        else {
          std::
          __shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x14e87d);
          std::atomic<bool>::operator=
                    ((atomic<bool> *)in_stack_ffffffffffffff20.__r,(bool)in_stack_ffffffffffffff1f);
          in_stack_ffffffffffffff28 =
               (X11MouseProcessor *)
               std::operator<<((ostream *)&std::cout,"Exiting Thread due to Unexpected error ");
          std::ostream::operator<<
                    ((ostream *)in_stack_ffffffffffffff28,std::endl<char,std::char_traits<char>>);
        }
        local_1 = 1;
        bVar1 = true;
      }
      std::shared_ptr<SL::Screen_Capture::Timer>::~shared_ptr
                ((shared_ptr<SL::Screen_Capture::Timer> *)0x14e944);
    } while (!bVar1);
  }
  else {
    local_1 = 0;
  }
  X11MouseProcessor::~X11MouseProcessor((X11MouseProcessor *)in_stack_ffffffffffffff20.__r);
  return (bool)(local_1 & 1);
}

Assistant:

bool TryCaptureMouse(const F &data, E... args)
    {
        T frameprocessor;
        frameprocessor.ImageBufferSize = 32 * 32 * sizeof(ImageBGRA);
        frameprocessor.ImageBuffer = std::make_unique<unsigned char[]>(frameprocessor.ImageBufferSize);
        auto ret = frameprocessor.Init(data);
        if (ret != DUPL_RETURN_SUCCESS) {
            return false;
        } 
        while (!data->CommonData_.TerminateThreadsEvent) {
            // get a copy of the shared_ptr in a safe way

            std::shared_ptr<Timer> timer;
            if constexpr(sizeof...(args) == 1) {
                timer = data->WindowCaptureData.MouseTimer;
            }
            else {
                timer = data->ScreenCaptureData.MouseTimer;
            }

            timer->start();
            // Process Frame
            ret = frameprocessor.ProcessFrame();
            if (ret != DUPL_RETURN_SUCCESS) {
                if (ret == DUPL_RETURN_ERROR_EXPECTED) {
                    // The system is in a transition state so request the duplication be restarted
                    data->CommonData_.ExpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to expected error " << std::endl;
                }
                else {
                    // Unexpected error so exit the application
                    data->CommonData_.UnexpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to Unexpected error " << std::endl;
                }
                return true;
            }
            timer->wait();
            while (data->CommonData_.Paused) {
                std::this_thread::sleep_for(50ms);
            }
        }
        return true;
    }